

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# askf_tx.c
# Opt level: O0

int tio_askfile(char *prompt,char *reply,int replen,int prompt_type,os_filetype_t file_type)

{
  int iVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  char *in_RSI;
  undefined4 unaff_retaddr;
  int in_stack_fffffffffffffffc;
  
  outformat((char *)CONCAT44(in_EDX,in_ECX));
  iVar1 = getstring((char *)CONCAT44(replen,prompt_type),(char *)CONCAT44(file_type,unaff_retaddr),
                    in_stack_fffffffffffffffc);
  if (iVar1 == 0) {
    iVar1 = 0;
    if (*in_RSI == '\0') {
      iVar1 = 2;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int tio_askfile(const char *prompt, char *reply, int replen,
                int prompt_type, os_filetype_t file_type)
{
    /* show the prompt */
    outformat((char *)prompt);

    /* ask for the filename */
    if (getstring(" >", reply, replen))
        return OS_AFE_FAILURE;
    
    /* 
     *   if they entered an empty line, return "cancel"; otherwise, return
     *   success 
     */
    return (reply[0] == '\0' ? OS_AFE_CANCEL : OS_AFE_SUCCESS);
}